

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int __thiscall
json::String::clone(String *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  String *this_00;
  
  this_00 = (String *)operator_new(0x28);
  String(this_00,this);
  return (int)this_00;
}

Assistant:

virtual Type* clone() const {
            return new String(*this);
        }